

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O1

void mbedtls_x509_crl_free(mbedtls_x509_crl *crl)

{
  mbedtls_x509_crl **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_x509_crl_entry *pmVar3;
  uchar *puVar4;
  size_t sVar5;
  mbedtls_asn1_named_data *__ptr;
  mbedtls_x509_crl_entry *__ptr_00;
  long lVar6;
  size_t sVar7;
  mbedtls_x509_crl *crl_cur;
  mbedtls_x509_crl *pmVar8;
  mbedtls_x509_crl *__ptr_01;
  
  pmVar8 = crl;
  if (crl != (mbedtls_x509_crl *)0x0) {
    do {
      free(pmVar8->sig_opts);
      __ptr = (pmVar8->issuer).next;
      while (__ptr != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = __ptr->next;
        lVar6 = 0;
        do {
          *(undefined1 *)((long)&(__ptr->oid).tag + lVar6) = 0;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x40);
        free(__ptr);
        __ptr = pmVar2;
      }
      __ptr_00 = (pmVar8->entry).next;
      while (__ptr_00 != (mbedtls_x509_crl_entry *)0x0) {
        pmVar3 = __ptr_00->next;
        lVar6 = 0;
        do {
          *(undefined1 *)((long)&(__ptr_00->raw).tag + lVar6) = 0;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x68);
        free(__ptr_00);
        __ptr_00 = pmVar3;
      }
      puVar4 = (pmVar8->raw).p;
      if (puVar4 != (uchar *)0x0) {
        sVar5 = (pmVar8->raw).len;
        if (sVar5 != 0) {
          sVar7 = 0;
          do {
            puVar4[sVar7] = '\0';
            sVar7 = sVar7 + 1;
          } while (sVar5 != sVar7);
        }
        free((pmVar8->raw).p);
      }
      ppmVar1 = &pmVar8->next;
      __ptr_01 = crl;
      pmVar8 = *ppmVar1;
    } while (*ppmVar1 != (mbedtls_x509_crl *)0x0);
    do {
      pmVar8 = __ptr_01->next;
      lVar6 = 0;
      do {
        *(undefined1 *)((long)&(__ptr_01->raw).tag + lVar6) = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x1a0);
      if (__ptr_01 != crl) {
        free(__ptr_01);
      }
      __ptr_01 = pmVar8;
    } while (pmVar8 != (mbedtls_x509_crl *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crl_free( mbedtls_x509_crl *crl )
{
    mbedtls_x509_crl *crl_cur = crl;
    mbedtls_x509_crl *crl_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_crl_entry *entry_cur;
    mbedtls_x509_crl_entry *entry_prv;

    if( crl == NULL )
        return;

    do
    {
#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( crl_cur->sig_opts );
#endif

        name_cur = crl_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        entry_cur = crl_cur->entry.next;
        while( entry_cur != NULL )
        {
            entry_prv = entry_cur;
            entry_cur = entry_cur->next;
            mbedtls_zeroize( entry_prv, sizeof( mbedtls_x509_crl_entry ) );
            mbedtls_free( entry_prv );
        }

        if( crl_cur->raw.p != NULL )
        {
            mbedtls_zeroize( crl_cur->raw.p, crl_cur->raw.len );
            mbedtls_free( crl_cur->raw.p );
        }

        crl_cur = crl_cur->next;
    }
    while( crl_cur != NULL );

    crl_cur = crl;
    do
    {
        crl_prv = crl_cur;
        crl_cur = crl_cur->next;

        mbedtls_zeroize( crl_prv, sizeof( mbedtls_x509_crl ) );
        if( crl_prv != crl )
            mbedtls_free( crl_prv );
    }
    while( crl_cur != NULL );
}